

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O3

void tcc_add_bcheck(TCCState *s1)

{
  uchar *puVar1;
  uchar *puVar2;
  int symbol;
  size_t sVar3;
  Section *pSVar4;
  
  pSVar4 = bounds_section;
  if (s1->do_bounds_check != 0) {
    sVar3 = section_add(bounds_section,8,1);
    puVar1 = pSVar4->data + sVar3;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    set_elf_sym(symtab_section,0,0,0x10,0,bounds_section->sh_num,"__bounds_start");
    symbol = set_elf_sym(symtab_section,0,0,0x10,0,0,"__bound_init");
    if (s1->output_type != 1) {
      pSVar4 = find_section(s1,".init");
      sVar3 = section_add(pSVar4,5,1);
      puVar2 = pSVar4->data;
      puVar1 = puVar2 + sVar3;
      puVar1[0] = 0xe8;
      puVar1[1] = 0xfc;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      puVar2[sVar3 + 4] = 0xff;
      put_elf_reloca(symtab_section,pSVar4,pSVar4->data_offset - 4,2,symbol,0);
      return;
    }
  }
  return;
}

Assistant:

ST_FUNC void tcc_add_bcheck(TCCState* s1) {
#ifdef CONFIG_TCC_BCHECK
  addr_t* ptr;
  int sym_index;

  if (0 == s1->do_bounds_check)
    return;
  /* XXX: add an object file to do that */
  ptr = section_ptr_add(bounds_section, sizeof(*ptr));
  *ptr = 0;
  set_elf_sym(symtab_section, 0, 0, ELFW(ST_INFO)(STB_GLOBAL, STT_NOTYPE), 0, bounds_section->sh_num, "__bounds_start");
  /* pull bcheck.o from libtcc1.a */
  sym_index = set_elf_sym(symtab_section, 0, 0, ELFW(ST_INFO)(STB_GLOBAL, STT_NOTYPE), 0, SHN_UNDEF, "__bound_init");
  if (s1->output_type != TCC_OUTPUT_MEMORY) {
    /* add 'call __bound_init()' in .init section */
    Section* init_section = find_section(s1, ".init");
    unsigned char* pinit = section_ptr_add(init_section, 5);
    pinit[0] = 0xe8;
    write32le(pinit + 1, -4);
    put_elf_reloc(symtab_section, init_section, init_section->data_offset - 4, R_386_PC32, sym_index);
    /* R_386_PC32 = R_X86_64_PC32 = 2 */
  }
#endif
}